

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTPNStmObject * __thiscall
CTcParser::parse_object_body
          (CTcParser *this,int *err,CTcSymObj *obj_sym,int is_class,int is_anon,int is_grammar,
          int is_nested,int modify,CTcSymObj *mod_orig_sym,int plus_cnt,CTcSymMetaclass *meta_sym,
          tcprs_term_info *term_info,int trans)

{
  tc_metaclass_t meta;
  tc_toktyp_t tVar1;
  int iVar2;
  CTPNStmObjectBase *pCVar3;
  CTcTokFileDesc *file;
  long lVar4;
  CTcSymObj *pCVar5;
  CTcSymObjBase *pCVar6;
  ulong obj;
  void *pvVar7;
  CTPNObjPropBase *pCVar8;
  int in_ECX;
  CTcSymObjBase *in_RDX;
  CTcPrsNode *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int *in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  long in_stack_00000028;
  undefined8 *in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000048;
  tcprs_term_info *in_stack_00000050;
  tcprs_term_info *in_stack_00000058;
  CTcPrsNode *expr_2;
  CTcConstVal cval_2;
  CTcDictPropEntry *dict_prop_1;
  CTPNObjProp *prop_1;
  CTcPrsNode *expr_1;
  CTcConstVal cval_1;
  size_t i;
  size_t new_alloc;
  CTPNObjProp *prop;
  CTcPrsNode *expr;
  CTcConstVal cval;
  CTPNStmObject *loc;
  CTcDictPropEntry *dict_prop;
  int old_self_valid;
  CTPNStmObject *obj_stm;
  int braces;
  tcprs_term_info my_term_info;
  undefined4 in_stack_fffffffffffffe08;
  int iVar9;
  int in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 uVar10;
  int in_stack_fffffffffffffe14;
  CTcTokenizer *in_stack_fffffffffffffe18;
  CTPNStmObject *in_stack_fffffffffffffe20;
  CTcSymbol *in_stack_fffffffffffffe28;
  CTPNStmObjectBase *in_stack_fffffffffffffe30;
  CTcConstVal *pCVar11;
  undefined8 in_stack_fffffffffffffe38;
  CTcPrsNode *in_stack_fffffffffffffe40;
  CTcPrsNode *expr_00;
  CTcSymProp *in_stack_fffffffffffffe48;
  CTPNObjDef *in_stack_fffffffffffffe50;
  CTPNObjDef *this_00;
  CTPNSuperclassList *in_stack_fffffffffffffe90;
  CTcSymObj *in_stack_fffffffffffffe98;
  CTcParser *in_stack_fffffffffffffea0;
  CTPNObjDef *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  long local_100;
  CTcConstVal local_e8;
  ulong local_c0;
  ulong local_b8;
  CTPNObjPropBase *local_b0;
  void *local_a8;
  CTcConstVal local_a0;
  long local_78;
  long local_70;
  undefined4 local_68;
  CTPNStmObjectBase *local_58;
  int local_4c;
  undefined8 local_48 [3];
  int local_2c;
  int local_28;
  int local_24;
  CTcSymObjBase *local_20;
  CTcPrsNode *local_18;
  CTPNStmObjectBase *local_8;
  
  if (in_stack_00000030 == (undefined8 *)0x0) {
    in_stack_00000030 = local_48;
  }
  local_4c = 0;
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pCVar3 = (CTPNStmObjectBase *)CTcPrsAllocObj::operator_new(0x21a14a);
  CTPNStmObject::CTPNStmObject
            (in_stack_fffffffffffffe20,(CTcSymObj *)in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe14);
  local_58 = pCVar3;
  if (local_20 != (CTcSymObjBase *)0x0) {
    CTcSymObjBase::set_obj_stm(local_20,(CTPNStmObject *)pCVar3);
  }
  if (in_stack_00000038 != 0) {
    CTPNStmObjectBase::set_transient(local_58);
  }
  local_68 = *(undefined4 *)(in_RDI + 0x220);
  *(undefined4 *)(in_RDI + 0x220) = 1;
  if ((local_28 != 0) && (local_20 != (CTcSymObjBase *)0x0)) {
    add_anon_obj((CTcParser *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (CTcSymObj *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  }
  pCVar3 = local_58;
  file = CTcTokenizer::get_last_desc(G_tok);
  lVar4 = CTcTokenizer::get_last_linenum(G_tok);
  CTPNStmBase::set_source_pos((CTPNStmBase *)pCVar3,file,lVar4);
  if (in_stack_00000010 == 0) {
    if ((local_28 == 0) && (local_2c == 0)) {
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x21a2ac);
      if (tVar1 == TOKT_COLON) {
        CTcTokenizer::next(in_stack_fffffffffffffe18);
      }
      else {
        CTcTokenizer::log_error_curtok
                  ((CTcTokenizer *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe0c);
      }
    }
    if (local_20 != (CTcSymObjBase *)0x0) {
      CTcSymObjBase::clear_sc_names(local_20);
    }
    CTPNObjDef::get_superclass_list(&local_58->super_CTPNObjDef);
    parse_superclass_list
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  else if (in_stack_00000018 != (int *)0x0) {
    CTPNStmObjectBase::add_superclass(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  }
  for (local_70 = *(long *)(in_RDI + 0x170); local_70 != 0; local_70 = *(long *)(local_70 + 8)) {
    *(byte *)(local_70 + 0x10) = *(byte *)(local_70 + 0x10) & 0xfe;
  }
  if (in_stack_00000020 != 0) {
    if (((*(long *)(in_RDI + 0x240) == 0) ||
        (*(ulong *)(in_RDI + 0x250) < (ulong)(long)in_stack_00000020)) ||
       (*(long *)(*(long *)(in_RDI + 0x248) + (long)(in_stack_00000020 + -1) * 8) == 0)) {
      CTcTokenizer::log_error(0x2b94);
    }
    else {
      local_78 = *(long *)(*(long *)(in_RDI + 0x248) + (long)(in_stack_00000020 + -1) * 8);
      pCVar5 = CTPNObjDef::get_obj_sym((CTPNObjDef *)(local_78 + 0x30));
      if (pCVar5 != (CTcSymObj *)0x0) {
        pCVar11 = &local_a0;
        CTcConstVal::CTcConstVal(pCVar11);
        pCVar6 = &CTPNObjDef::get_obj_sym((CTPNObjDef *)(local_78 + 0x30))->super_CTcSymObjBase;
        obj = CTcSymObjBase::get_obj_id(pCVar6);
        pCVar6 = &CTPNObjDef::get_obj_sym((CTPNObjDef *)(local_78 + 0x30))->super_CTcSymObjBase;
        meta = CTcSymObjBase::get_metaclass(pCVar6);
        CTcConstVal::set_obj(pCVar11,obj,meta);
        pvVar7 = CTcPrsAllocObj::operator_new(0x21a4b9);
        CTPNConst::CTPNConst
                  ((CTPNConst *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (CTcConstVal *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        local_a8 = pvVar7;
        local_b0 = &CTPNObjDef::add_prop
                              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                               in_stack_fffffffffffffe40,
                               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                               (int)in_stack_fffffffffffffe38)->super_CTPNObjPropBase;
        CTPNObjPropBase::set_overwritable(local_b0);
      }
    }
  }
  if ((in_stack_00000008 == 0) && ((local_24 == 0 || (in_stack_00000020 != 0)))) {
    if (*(ulong *)(in_RDI + 0x250) <= (ulong)(long)in_stack_00000020) {
      local_b8 = (ulong)(in_stack_00000020 + 0x10);
      pvVar7 = realloc(*(void **)(in_RDI + 0x248),local_b8 << 3);
      *(void **)(in_RDI + 0x248) = pvVar7;
      for (local_c0 = *(ulong *)(in_RDI + 0x250); local_c0 < local_b8; local_c0 = local_c0 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x248) + local_c0 * 8) = 0;
      }
      *(ulong *)(in_RDI + 0x250) = local_b8;
    }
    *(CTPNStmObjectBase **)(*(long *)(in_RDI + 0x248) + (long)in_stack_00000020 * 8) = local_58;
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x21a683);
  if (tVar1 == TOKT_LBRACE) {
    CTcTokenizer::next(in_stack_fffffffffffffe18);
    local_4c = 1;
  }
  parse_obj_template((CTcParser *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0,(int)((ulong)in_RDI >> 0x20));
  if (*(int *)&(local_18->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase == 0) {
    if ((local_4c == 0) &&
       (tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x21a745), tVar1 == TOKT_LBRACE)) {
      local_4c = 1;
      CTcTokenizer::next(in_stack_fffffffffffffe18);
    }
    if ((in_stack_00000008 != 0) && (local_4c == 0)) {
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)*in_stack_00000030,in_stack_00000030[1],
                         TC_SEV_ERROR,0x2baf);
      *(undefined4 *)(in_stack_00000030 + 2) = 1;
    }
    if ((local_24 == 0) && (in_stack_00000010 == 0)) {
      CTcConstVal::CTcConstVal(&local_e8);
      lVar4 = *(long *)(in_RDI + 0xe0);
      *(long *)(in_RDI + 0xe0) = lVar4 + 1;
      CTcConstVal::set_int(&local_e8,lVar4);
      CTcPrsAllocObj::operator_new(0x21a818);
      CTPNConst::CTPNConst
                ((CTPNConst *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (CTcConstVal *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      pCVar8 = &CTPNObjDef::add_prop
                          (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                           ,(int)in_stack_fffffffffffffe38)->super_CTPNObjPropBase;
      CTPNObjPropBase::set_overwritable(pCVar8);
      if ((*(byte *)(in_RDI + 0xec) >> 1 & 1) != 0) {
        CTcConstVal::set_obj(&local_e8,(ulong)*(uint *)(in_RDI + 0xe8),TC_META_TADSOBJ);
        CTcPrsAllocObj::operator_new(0x21a8cb);
        CTPNConst::CTPNConst
                  ((CTPNConst *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (CTcConstVal *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        pCVar8 = &CTPNObjDef::add_prop
                            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                             in_stack_fffffffffffffe40,
                             (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                             (int)in_stack_fffffffffffffe38)->super_CTPNObjPropBase;
        CTPNObjPropBase::set_overwritable(pCVar8);
      }
    }
    this_00 = (CTPNObjDef *)0x0;
    if (local_58 != (CTPNStmObjectBase *)0x0) {
      this_00 = &local_58->super_CTPNObjDef;
    }
    uVar10 = 0;
    iVar9 = local_4c;
    pCVar3 = local_58;
    iVar2 = parse_obj_prop_list((CTcParser *)CONCAT44(in_stack_00000024,in_stack_00000020),
                                in_stack_00000018,
                                (CTPNObjDef *)CONCAT44(in_stack_00000014,in_stack_00000010),
                                (CTcSymMetaclass *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                                unaff_retaddr_00,unaff_retaddr,in_stack_00000040,in_stack_00000048,
                                in_stack_00000050,in_stack_00000058);
    if (iVar2 == 0) {
      *(undefined4 *)(in_RDI + 0x220) = local_68;
      local_8 = (CTPNStmObjectBase *)0x0;
    }
    else {
      if ((local_58 != (CTPNStmObjectBase *)0x0) && (in_stack_00000028 == 0)) {
        expr_00 = local_18;
        for (local_100 = *(long *)(in_RDI + 0x170); local_100 != 0;
            local_100 = *(long *)(local_100 + 8)) {
          if ((*(byte *)(local_100 + 0x10) & 1) == 0) {
            pCVar11 = (CTcConstVal *)&stack0xfffffffffffffed8;
            CTcConstVal::CTcConstVal(pCVar11);
            CTcConstVal::set_vocab_list(pCVar11);
            pvVar7 = CTcPrsAllocObj::operator_new(0x21aac9);
            CTPNConst::CTPNConst
                      ((CTPNConst *)CONCAT44(in_stack_fffffffffffffe14,uVar10),
                       (CTcConstVal *)CONCAT44(in_stack_fffffffffffffe0c,iVar9));
            CTPNObjDef::add_prop
                      (this_00,(CTcSymProp *)pCVar3,expr_00,(int)((ulong)pvVar7 >> 0x20),(int)pvVar7
                      );
          }
        }
      }
      *(undefined4 *)(in_RDI + 0x220) = local_68;
      local_8 = local_58;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x220) = local_68;
    local_8 = (CTPNStmObjectBase *)0x0;
  }
  return (CTPNStmObject *)local_8;
}

Assistant:

CTPNStmObject *CTcParser::parse_object_body(
    int *err, CTcSymObj *obj_sym,
    int is_class, int is_anon, int is_grammar, int is_nested,
    int modify, CTcSymObj *mod_orig_sym, int plus_cnt,
    CTcSymMetaclass *meta_sym, tcprs_term_info *term_info, int trans)
{
    /* 
     *   If we don't have an enclosing term_info, use my own; if a valid
     *   term_info was passed in, continue using the enclosing one.  We
     *   always want to use the outermost term_info, because our heuristic
     *   is to assume that any lack of termination applies to the first
     *   object it possibly could apply to. 
     */
    tcprs_term_info my_term_info;
    if (term_info == 0)
        term_info = &my_term_info;

    /* presume the object won't use braces around its property list */
    int braces = FALSE;

    /* create the object statement */
    CTPNStmObject *obj_stm = new CTPNStmObject(obj_sym, is_class);
    if (obj_sym != 0)
        obj_sym->set_obj_stm(obj_stm);

    /* set the 'transient' status if appropriate */
    if (trans)
        obj_stm->set_transient();

    /* remember whether 'self' was valid in the enclosing context */
    int old_self_valid = self_valid_;

    /* 'self' is valid within object definitions */
    self_valid_ = TRUE;

    /* if it's anonymous, add it to the anonymous object list */
    if (is_anon && obj_sym != 0)
        add_anon_obj(obj_sym);

    /* 
     *   set the object's line location (we must do this explicitly
     *   because we're in a top-level statement and hence do not have a
     *   current source position saved at the moment) 
     */
    obj_stm->set_source_pos(G_tok->get_last_desc(),
                            G_tok->get_last_linenum());

    /* 
     *   If we're not modifying, parse the class list.  If this is a
     *   'modify' statement, there's no class list.  
     */
    if (!modify)
    {
        /* 
         *   Parse and skip the colon, if required.  All objects except
         *   anonymous objects and grammar rule definitions have the colon;
         *   for anonymous objects and grammar definitions, the caller is
         *   required to advance us to the class list before parsing the
         *   object body.  
         */
        if (is_anon || is_grammar)
        {
            /* 
             *   it's anonymous, or it's a grammar definition - the caller
             *   will have already advanced us to the class list, so there's
             *   no need to look for a colon 
             */
        }
        else if (G_tok->cur() == TOKT_COLON)
        {
            /* skip the colon */
            G_tok->next();
        }
        else
        {
            /* it's an error, but assume they simply left off the colon */
            G_tok->log_error_curtok(TCERR_OBJDEF_REQ_COLON);
        }

        /* 
         *   Drop any existing list of superclass names from the symbol.  We
         *   might have a list of names from loading the symbol file; if so,
         *   forget that, and use the list defined here instead.  
         */
        if (obj_sym != 0)
            obj_sym->clear_sc_names();
        
        /* parse the superclass list */
        parse_superclass_list(obj_sym, obj_stm->get_superclass_list());
    }
    else
    {
        /*
         *   This is a 'modify' statement.  The original pre-modified
         *   object is our single superclass. 
         *   
         *   Note that we do not do anything with the superclass name list,
         *   because we're reassigning the symbol representing the global
         *   name of the object (obj_sym) to refer to the new modifier
         *   object.  As far as the name structure of the program is
         *   concerned, this object's superclass list is the same as the
         *   original object's superclass list.  
         */
        if (mod_orig_sym != 0)
            obj_stm->add_superclass(mod_orig_sym);
    }

    /* 
     *   clear the list of dictionary properties, so we can keep track of
     *   which dictionary properties this object explicitly defines 
     */
    for (CTcDictPropEntry *dict_prop = dict_prop_head_ ; dict_prop != 0 ;
         dict_prop = dict_prop->nxt_)
    {
        /* mark this dictionary property as not defined for this object */
        dict_prop->defined_ = FALSE;
    }

    /*
     *   If we have a '+' list, figure the object's location by finding
     *   the item in the location stack at the desired depth. 
     */
    if (plus_cnt != 0)
    {
        /* 
         *   if no '+' property has been defined, or they're asking for a
         *   nesting level that doesn't exist, note the error and ignore the
         *   '+' setting 
         */
        if (plus_prop_ == 0
            || (size_t)plus_cnt > plus_stack_alloc_
            || plus_stack_[plus_cnt - 1] == 0)
        {
            /* log the error */
            G_tok->log_error(TCERR_PLUSOBJ_TOO_MANY);
        }
        else
        {
            /* 
             *   find the object - the location of an object with N '+'
             *   signs is the object most recently defined with N-1 '+'
             *   signs 
             */
            CTPNStmObject *loc = plus_stack_[plus_cnt - 1];

            /* add the '+' property value, if it's a valid object symbol */
            if (loc->get_obj_sym() != 0)
            {
                /* set up a constant expression for the object reference */
                CTcConstVal cval;
                cval.set_obj(loc->get_obj_sym()->get_obj_id(),
                             loc->get_obj_sym()->get_metaclass());
                CTcPrsNode *expr = new CTPNConst(&cval);
                
                /* add the location property */
                CTPNObjProp *prop = obj_stm->add_prop(
                    plus_prop_, expr, FALSE, FALSE);

                /* 
                 *   mark it as overwritable, since it was added via the '+'
                 *   notation 
                 */
                prop->set_overwritable();
            }
        }
    }

    /*
     *   Remember this object as the most recent object defined with its
     *   number of '+' signs.  Only pay attention to '+' signs for top-level
     *   objects - if this is a nested object, it doesn't participate in the
     *   '+' mechanism at all.  Also, ignore classes defined with no '+'
     *   signs - the '+' mechanism is generally only useful for instances,
     *   so ignore it for classes that don't use the notation explicitly.  
     */
    if (!is_nested && (!is_class || plus_cnt != 0))
    {
        /* first, allocate more space in the '+' stack if necessary */
        if ((size_t)plus_cnt >= plus_stack_alloc_)
        {
            size_t new_alloc;
            size_t i;
            
            /* 
             *   allocate more space - go a bit above what we need to avoid
             *   having to reallocate again immediately if they a few levels
             *   deeper 
             */
            new_alloc = plus_cnt + 16;
            plus_stack_ = (CTPNStmObject **)
                          t3realloc(plus_stack_,
                                    new_alloc * sizeof(*plus_stack_));
            
            /* clear out the newly-allocated entries */
            for (i = plus_stack_alloc_ ; i < new_alloc ; ++i)
                plus_stack_[i] = 0;
            
            /* remember the new allocation size */
            plus_stack_alloc_ = new_alloc;
        }
        
        /* remember this object as the last object at its depth */
        plus_stack_[plus_cnt] = obj_stm;
    }

    /*
     *   Check for an open brace.  If the object uses braces around its
     *   property list, template properties can be either before the open
     *   brace or just inside it. 
     */
    if (G_tok->cur() == TOKT_LBRACE)
    {
        /* skip the open brace */
        G_tok->next();

        /* note that we're using braces */
        braces = TRUE;
    }

    /* check for template syntax */
    parse_obj_template(err, obj_stm, FALSE);
    if (*err)
    {
        self_valid_ = old_self_valid;
        return 0;
    }

    /*
     *   If we didn't already find an open brace, try again now that we've
     *   scanned the template properties, since template properties can
     *   either immediately precede or immediately follow the open brace, if
     *   present. 
     */
    if (!braces && G_tok->cur() == TOKT_LBRACE)
    {
        /* note that we're using braces */
        braces = TRUE;

        /* skip the open brace */
        G_tok->next();
    }

    /*
     *   If this is a nested object, the property list must be enclosed in
     *   braces.  If we haven't found a brace by this point, it's an error.  
     */
    if (is_nested && !braces)
    {
        /* 
         *   No braces - this is illegal, because a nested object requires
         *   braces.  The most likely error is that the previous object was
         *   not properly terminated, and this is simply a new object
         *   definition.  Flag the error as a missing terminator on the
         *   enclosing object.  
         */
        G_tcmain->log_error(term_info->desc_, term_info->linenum_,
                            TC_SEV_ERROR, TCERR_UNTERM_OBJ_DEF);

        /* set the termination error flag for the caller */
        term_info->unterm_ = TRUE;
    }

    /*
     *   If we're not a class, and we're not a 'modify', add the automatic
     *   'sourceTextOrder' property, add the 'sourceTextGroup' if desired.
     *   sourceTextOrder provides a source file sequence number that can be
     *   used to order a set of objects into the same sequence in which they
     *   appeared in the original source file, which is often useful for
     *   assembling pre-initialized structures.  sourceTextGroup identifies
     *   the file itself.  
     */
    if (!is_class && !modify)
    {
        /* set up the constant expression for the source sequence number */
        CTcConstVal cval;
        cval.set_int(src_order_idx_++);
        CTcPrsNode *expr = new CTPNConst(&cval);

        /* create the new sourceTextOrder property */
        CTPNObjProp *prop = obj_stm->add_prop(
            src_order_sym_, expr, FALSE, FALSE);

        /* mark it as overwritable with an explicit property definition */
        prop->set_overwritable();

        /* if we're generating sourceTextGroup properties, add it */
        if (src_group_mode_)
        {
            /* set up the expression for the source group object */
            cval.set_obj(src_group_id_, TC_META_TADSOBJ);
            expr = new CTPNConst(&cval);

            /* create the new sourceTextGroup property */
            prop = obj_stm->add_prop(src_group_sym_, expr, FALSE, FALSE);

            /* mark it as overwritable */
            prop->set_overwritable();
        }
    }

    /* parse the property list */
    if (!parse_obj_prop_list(
        err, obj_stm, meta_sym, modify, is_nested, braces, FALSE,
        &my_term_info, term_info))
    {
        self_valid_ = old_self_valid;
        return 0;
    }

    /* 
     *   Finish the object by adding dictionary property placeholders.  Don't
     *   bother if this is an intrinsic class modifier, since intrinsic class
     *   objects can't have dictionary associations.  
     */
    if (obj_stm != 0 && meta_sym == 0)
    {
        /* 
         *   Add a placeholder for each dictionary property we didn't
         *   explicitly define for the object.  This will ensure that we have
         *   enough property slots pre-allocated at link time if the object
         *   inherits vocabulary from its superclasses.  The linker will
         *   remove any slots that end up being unused, so this won't affect
         *   run-time efficiency or the ultimate size of the image file.
         */
        for (CTcDictPropEntry *dict_prop = dict_prop_head_ ; dict_prop != 0 ;
             dict_prop = dict_prop->nxt_)
        {
            /* if this one isn't defined, add a placeholder */
            if (!dict_prop->defined_)
            {
                /* set up a VOCAB_LIST value */
                CTcConstVal cval;
                cval.set_vocab_list();
                CTcPrsNode *expr = new CTPNConst(&cval);

                /* add it */
                obj_stm->add_prop(dict_prop->prop_, expr, FALSE, FALSE);
            }
        }
    }

    /* restore the enclosing 'self' validity */
    self_valid_ = old_self_valid;

    /* return the object statement node */
    return obj_stm;
}